

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atomtab_a(iasctx *ctx,void *v,int spos)

{
  int iVar1;
  matches *b;
  long lVar2;
  long lVar3;
  matches **ppmVar4;
  undefined8 *puVar5;
  byte bVar6;
  match in_stack_fffffffffffffe38;
  matches *subm;
  match sm;
  matches *pmStack_30;
  int i;
  matches *res;
  insn *tab;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  bVar6 = 0;
  pmStack_30 = emptymatches();
  sm._180_4_ = 0;
  while( true ) {
    iVar1 = var_ok(*(int *)((long)v + (long)(int)sm._180_4_ * 0x318 + 0x310),
                   *(int *)((long)v + (long)(int)sm._180_4_ * 0x318 + 0x314),ctx->varinfo);
    if (iVar1 != 0) {
      memset(&subm,0,0xb8);
      sm._0_8_ = *(undefined8 *)((long)v + (long)(int)sm._180_4_ * 0x318);
      sm.a[1] = *(ull *)((long)v + (long)(int)sm._180_4_ * 0x318 + 8);
      sm.m[1]._0_4_ = spos;
      lVar2 = (long)(int)sm._180_4_;
      ppmVar4 = &subm;
      puVar5 = (undefined8 *)&stack0xfffffffffffffe38;
      for (lVar3 = 0x17; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *ppmVar4;
        ppmVar4 = ppmVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      b = tabdesc(ctx,in_stack_fffffffffffffe38,(atom *)((long)v + lVar2 * 0x318 + 0x10));
      if (b != (matches *)0x0) {
        pmStack_30 = catmatches(pmStack_30,b);
      }
    }
    if (((*(long *)((long)v + (long)(int)sm._180_4_ * 0x318 + 8) == 0) &&
        (*(int *)((long)v + (long)(int)sm._180_4_ * 0x318 + 0x310) == 0)) &&
       (*(int *)((long)v + (long)(int)sm._180_4_ * 0x318 + 0x314) == 0)) break;
    sm._180_4_ = sm._180_4_ + 1;
  }
  return pmStack_30;
}

Assistant:

struct matches *atomtab_a APROTO {
	const struct insn *tab = v;
	struct matches *res = emptymatches();
	int i;
	for (i = 0; ; i++) {
		if (var_ok(tab[i].fmask, tab[i].ptype, ctx->varinfo)) {
			struct match sm = { 0, .a = {tab[i].val}, .m = {tab[i].mask}, .lpos = spos };
			struct matches *subm = tabdesc(ctx, sm, tab[i].atoms);
			if (subm)
				res = catmatches(res, subm);
		}
		if (!tab[i].mask && !tab[i].fmask && !tab[i].ptype) break;
	}
	return res;
}